

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O0

void Executor::declareSequence(treeNode *node,string *flag)

{
  treeNode *node_00;
  bool bVar1;
  Var *pVVar2;
  Var *extraout_RAX;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  string local_a8;
  string local_88;
  Var *local_68;
  Var *var;
  string local_50;
  Var *local_30;
  Var *defalutVal;
  treeNode *val;
  treeNode *id;
  string *flag_local;
  treeNode *node_local;
  
  val = node->child[0];
  defalutVal = (Var *)node->child[1];
  id = (treeNode *)flag;
  flag_local = (string *)node;
  if ((node->kind).stmtKind == doRpt) {
    pVVar2 = (Var *)operator_new(0x38);
    memset(pVVar2,0,0x38);
    Var::Var(pVVar2);
    local_30 = pVVar2;
    bVar1 = std::operator==(flag,"int");
    if (bVar1) {
      (local_30->value).integer = 0;
      local_30->kind = Integer;
    }
    else {
      bVar1 = std::operator==(flag,"float");
      if (bVar1) {
        (local_30->value).integer = 0;
        local_30->kind = Decmical;
      }
      else {
        bVar1 = std::operator==(flag,"bool");
        if (bVar1) {
          (local_30->value).boolean = false;
          local_30->kind = Boolean;
        }
        else {
          bVar1 = std::operator==(flag,"string");
          if (bVar1) {
            std::__cxx11::string::operator=((string *)&local_30->text,"");
            local_30->kind = Text;
          }
        }
      }
    }
    std::__cxx11::string::string((string *)&local_50,(string *)flag_local[1].field_2._M_local_buf);
    setVar(&local_50,local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else if (val->child[0] == (treeNode *)0x0) {
    pVVar2 = (Var *)operator_new(0x38);
    memset(pVVar2,0,0x38);
    Var::Var(pVVar2);
    __x = extraout_XMM0_Qa;
    local_68 = pVVar2;
    if (*(long *)((long)&(defalutVal->text).field_2 + 8) != 0) {
      reportError(errorType);
      __x = extraout_XMM0_Qa_00;
    }
    exp(__x);
    defalutVal = extraout_RAX;
    bVar1 = std::operator==(flag,"int");
    if (bVar1) {
      if ((int)defalutVal[1].text._M_string_length != 0) {
        reportError(errorType);
      }
      local_68->value = *(Value *)((long)&defalutVal[1].text._M_string_length + 4);
      local_68->kind = Integer;
    }
    else {
      bVar1 = std::operator==(flag,"float");
      if (bVar1) {
        if ((int)defalutVal[1].text._M_string_length != 1) {
          reportError(errorType);
        }
        local_68->value = *(Value *)((long)&defalutVal[1].text._M_string_length + 4);
        local_68->kind = Decmical;
      }
      else {
        bVar1 = std::operator==(flag,"bool");
        if (bVar1) {
          if ((int)defalutVal[1].text._M_string_length != 2) {
            reportError(errorType);
          }
          (local_68->value).boolean =
               (bool)(*(byte *)((long)&defalutVal[1].text._M_string_length + 4) & 1);
          local_68->kind = Boolean;
        }
        else {
          bVar1 = std::operator==(flag,"string");
          if (bVar1) {
            if ((int)defalutVal[1].text._M_string_length != 3) {
              reportError(errorType);
            }
            std::__cxx11::string::operator=((string *)&local_68->text,(string *)&defalutVal->kind);
            local_68->kind = Text;
          }
        }
      }
    }
    std::__cxx11::string::string((string *)&local_88,(string *)&val->text);
    setVar(&local_88,local_68);
    std::__cxx11::string::~string((string *)&local_88);
    pVVar2 = defalutVal;
    if (defalutVal != (Var *)0x0) {
      treeNode::~treeNode((treeNode *)defalutVal);
      operator_delete(pVVar2);
    }
  }
  if (flag_local[1]._M_string_length != 0) {
    node_00 = (treeNode *)flag_local[1]._M_string_length;
    std::__cxx11::string::string((string *)&local_a8,(string *)flag);
    declareSequence(node_00,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return;
}

Assistant:

void declareSequence(treeNode* node,string flag)
    {
        auto id = node->child[0];
        auto val = node->child[1];
        if(node->kind.expKind==ExpKind::idExp)
        {
            auto defalutVal = new Var();
            if(flag=="int")         {defalutVal->value.integer=0;defalutVal->kind=AttrKind::Integer;}
            else if(flag=="float")  {defalutVal->value.decmical=0;defalutVal->kind=AttrKind::Decmical;}
            else if(flag=="bool")   {defalutVal->value.boolean=false;defalutVal->kind=AttrKind::Boolean;}
            else if(flag=="string") {defalutVal->text="";defalutVal->kind=AttrKind::Text;}
            setVar(node->text,defalutVal);
        }
        else if(id->child[0]!=nullptr)//是数组！麻烦死了
        {
            // auto p1 = id->child[0];
            // auto p2 = val;
            
        }
        else
        {
            auto var = new Var();
            if(val->sibling!=nullptr)reportError(Error::errorType);
            val = exp(val);
            if(flag=="int")
            {
                if(val->attrKind!=AttrKind::Integer)reportError(Error::errorType);
                var->value.integer=val->attr.integer;
                var->kind=AttrKind::Integer;
            }
            else if(flag=="float")
            {
                if(val->attrKind!=AttrKind::Decmical)reportError(Error::errorType);
                var->value.decmical=val->attr.decmical;
                var->kind=AttrKind::Decmical;
            }
            else if(flag=="bool")
            {
                if(val->attrKind!=AttrKind::Boolean)reportError(Error::errorType);
                var->value.boolean=val->attr.boolean;
                var->kind=AttrKind::Boolean;
            }
            else if(flag=="string")
            {
                if(val->attrKind!=AttrKind::Text)reportError(Error::errorType);
                var->text=val->text;
                var->kind=AttrKind::Text;
            }
            setVar(id->text,var);
            delete val;
        }
        if(node->sibling!=nullptr)declareSequence(node->sibling,flag);
    }